

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O3

size_t __thiscall cppurses::Text_display::display_height(Text_display *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar3 = (this->super_Widget).outer_height_;
  sVar4 = ((long)(this->display_state_).
                 super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->display_state_).
                 super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) - this->top_line_;
  sVar1 = detail::Border_offset::north(&this->super_Widget);
  sVar2 = detail::Border_offset::south(&this->super_Widget);
  if (sVar3 - (sVar2 + sVar1) < sVar4) {
    sVar4 = (this->super_Widget).outer_height_;
    sVar3 = detail::Border_offset::north(&this->super_Widget);
    sVar1 = detail::Border_offset::south(&this->super_Widget);
    sVar4 = sVar4 - (sVar1 + sVar3);
  }
  return sVar4;
}

Assistant:

std::size_t Text_display::display_height() const {
    auto difference = 1 + this->last_line() - this->top_line();
    if (difference > this->height()) {
        difference = this->height();
    }
    return difference;
}